

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O1

void __thiscall
t_javame_generator::generate_deserialize_set_element
          (t_javame_generator *this,ostream *out,t_set *tset,string *prefix)

{
  t_type *ptVar1;
  ostream *poVar2;
  t_javame_generator *ptVar3;
  string elem;
  t_field felem;
  string local_1e0;
  undefined1 local_1c0 [32];
  string local_1a0;
  string local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  char local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  char local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  char local_110 [16];
  string local_100;
  t_field local_e0;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"_elem","");
  t_generator::tmp((string *)local_1c0,(t_generator *)this,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  ptVar1 = tset->elem_type_;
  local_120._M_allocated_capacity = (size_type)local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_1c0._0_8_,(pointer)(local_1c0._0_8_ + local_1c0._8_8_));
  t_field::t_field(&local_e0,ptVar1,(string *)&local_120);
  if ((char *)local_120._M_allocated_capacity != local_110) {
    operator_delete((void *)local_120._M_allocated_capacity);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&local_1e0,this,&local_e0,false);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  local_140._M_allocated_capacity = (size_type)local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
  generate_deserialize_field(this,out,&local_e0,(string *)&local_140);
  if ((char *)local_140._M_allocated_capacity != local_130) {
    operator_delete((void *)local_140._M_allocated_capacity);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".put(",5);
  ptVar1 = tset->elem_type_;
  ptVar3 = (t_javame_generator *)local_1c0._0_8_;
  local_160._M_allocated_capacity = (size_type)local_150;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_1c0._0_8_,(pointer)(local_1c0._0_8_ + local_1c0._8_8_));
  box_type(&local_1e0,ptVar3,ptVar1,(string *)&local_160);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  ptVar1 = tset->elem_type_;
  ptVar3 = (t_javame_generator *)local_1c0._0_8_;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_1c0._0_8_,(pointer)(local_1c0._0_8_ + local_1c0._8_8_));
  box_type(&local_180,ptVar3,ptVar1,&local_1a0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_180._M_dataplus._M_p,local_180._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((char *)local_160._M_allocated_capacity != local_150) {
    operator_delete((void *)local_160._M_allocated_capacity);
  }
  t_field::~t_field(&local_e0);
  if ((t_javame_generator *)local_1c0._0_8_ != (t_javame_generator *)(local_1c0 + 0x10)) {
    operator_delete((void *)local_1c0._0_8_);
  }
  return;
}

Assistant:

void t_javame_generator::generate_deserialize_set_element(ostream& out,
                                                          t_set* tset,
                                                          string prefix) {
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << declare_field(&felem) << endl;

  generate_deserialize_field(out, &felem);

  indent(out) << prefix << ".put(" << box_type(tset->get_elem_type(), elem) << ", "
              << box_type(tset->get_elem_type(), elem) << ");" << endl;
}